

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O2

wstring * __thiscall
GdlFeatureSetting::FindBasicExtName_abi_cxx11_
          (wstring *__return_storage_ptr__,GdlFeatureSetting *this)

{
  pointer pGVar1;
  utf16 uVar2;
  pointer pGVar3;
  GdlExtName extname;
  undefined1 local_80 [72];
  utf16 local_38;
  
  pGVar3 = (this->m_vextname).super__Vector_base<GdlExtName,_std::allocator<GdlExtName>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar1 = (this->m_vextname).super__Vector_base<GdlExtName,_std::allocator<GdlExtName>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pGVar3 == pGVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
      return __return_storage_ptr__;
    }
    GdlExtName::GdlExtName((GdlExtName *)local_80,pGVar3);
    uVar2 = local_38;
    if ((local_38 == 0x409) || (local_38 == 0)) {
      std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)(local_80 + 0x28))
      ;
    }
    GdlExtName::~GdlExtName((GdlExtName *)local_80);
    if (uVar2 == 0) break;
    if (uVar2 == 0x409) {
      return __return_storage_ptr__;
    }
    pGVar3 = pGVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring GdlFeatureSetting::FindBasicExtName() // find an English or language-neutral label
{
	for (auto const extname: m_vextname)
	{
		if (extname.m_wLanguageID == 1033
				|| extname.m_wLanguageID == 0)
			return extname.m_stuName;
	}
	return std::wstring();
}